

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O1

void free_linsys_solver_pardiso(pardiso_solver *s)

{
  c_float *a;
  
  if (s != (pardiso_solver *)0x0) {
    s->phase = -1;
    a = &s->fdum;
    pardiso(s->pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,a,s->KKT_p,s->KKT_i,&s->idum,
            &s->nrhs,s->iparm,&s->msglvl,a,a,&s->error);
    if (s->error != 0) {
      printf("ERROR in %s: ","free_linsys_solver_pardiso");
      printf("Error during MKL Pardiso cleanup: %d",(ulong)(uint)s->error);
      putchar(10);
    }
    if (s->KKT != (csc *)0x0) {
      csc_spfree(s->KKT);
    }
    if (s->KKT_i != (c_int *)0x0) {
      free(s->KKT_i);
    }
    if (s->KKT_p != (c_int *)0x0) {
      free(s->KKT_p);
    }
    if (s->bp != (c_float *)0x0) {
      free(s->bp);
    }
    if (s->sol != (c_float *)0x0) {
      free(s->sol);
    }
    if (s->rho_inv_vec != (c_float *)0x0) {
      free(s->rho_inv_vec);
    }
    if (s->Pdiag_idx != (c_int *)0x0) {
      free(s->Pdiag_idx);
    }
    if (s->PtoKKT != (c_int *)0x0) {
      free(s->PtoKKT);
    }
    if (s->AtoKKT != (c_int *)0x0) {
      free(s->AtoKKT);
    }
    if (s->rhotoKKT != (c_int *)0x0) {
      free(s->rhotoKKT);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

void free_linsys_solver_pardiso(pardiso_solver *s) {
    if (s) {

        // Free pardiso solver using internal function
        s->phase = PARDISO_CLEANUP;
        pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
                 &(s->nKKT), &(s->fdum), s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
                 s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));

      if ( s->error != 0 ){
#ifdef PRINTING
          c_eprint("Error during MKL Pardiso cleanup: %d", (int)s->error);
#endif
      }
        // Check each attribute of the structure and free it if it exists
        if (s->KKT)         csc_spfree(s->KKT);
        if (s->KKT_i)       c_free(s->KKT_i);
        if (s->KKT_p)       c_free(s->KKT_p);
        if (s->bp)          c_free(s->bp);
        if (s->sol)         c_free(s->sol);
        if (s->rho_inv_vec) c_free(s->rho_inv_vec);

        // These are required for matrix updates
        if (s->Pdiag_idx) c_free(s->Pdiag_idx);
        if (s->PtoKKT)    c_free(s->PtoKKT);
        if (s->AtoKKT)    c_free(s->AtoKKT);
        if (s->rhotoKKT)  c_free(s->rhotoKKT);

        c_free(s);

    }
}